

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteSmv.c
# Opt level: O3

char * cleanUNSAFE(char *s)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  char *pcVar4;
  
  sVar2 = strlen(s);
  if (sVar2 < 0x400) {
    pcVar4 = cleanUNSAFE::buffer;
    strcpy(cleanUNSAFE::buffer,s);
    while( true ) {
      bVar1 = *pcVar4;
      bVar3 = 0x5f;
      if ((bVar1 != 0x7c) && (bVar3 = bVar1, bVar1 == 0)) break;
      *pcVar4 = bVar3;
      pcVar4 = (char *)((byte *)pcVar4 + 1);
    }
    return (char *)(ulong)bVar1;
  }
  __assert_fail("strlen(s) < 1024",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteSmv.c"
                ,0x31,"char *cleanUNSAFE(const char *)");
}

Assistant:

static char *cleanUNSAFE( const char *s )
{
    char *t;
    static char buffer[1024];
    assert (strlen(s) < 1024);
    strcpy(buffer, s);
    for (t = buffer; *t != 0; ++t) *t = (*t == '|') ? '_' : *t;
    return buffer;
}